

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void setCmdOptionsAndRun(Carver *carver,int argc,char **argv)

{
  char **end;
  bool bVar1;
  int carveCount;
  char *pcVar2;
  char *__s;
  int iVar3;
  CarveMode carveMode;
  float carveAmount;
  float fVar4;
  allocator<char> local_201;
  string filename;
  string carveModeStr;
  string outputStr;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110 [2];
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&carveModeStr,"-h",(allocator<char> *)&outputStr);
  end = argv + argc;
  bVar1 = cmdOptionExists(argv,end,&carveModeStr);
  std::__cxx11::string::~string((string *)&carveModeStr);
  if (bVar1) {
    usage();
    exit(0);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&carveModeStr,"-m",(allocator<char> *)&outputStr);
  pcVar2 = getCmdOption(argv,end,&carveModeStr,true);
  std::__cxx11::string::~string((string *)&carveModeStr);
  if (pcVar2 == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"Carve mode value missing",(allocator<char> *)&carveModeStr);
    terminate(1,&local_50);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&carveModeStr,pcVar2,(allocator<char> *)&outputStr);
  bVar1 = std::operator==(&carveModeStr,"both");
  if (bVar1) {
    carveMode = BOTH;
  }
  else {
    bVar1 = std::operator==(&carveModeStr,"vertical");
    carveMode = VERTICAL;
    if (!bVar1) {
      bVar1 = std::operator==(&carveModeStr,"horizontal");
      carveMode = HORIZONTAL;
      if (!bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,"Carve mode value invalid",(allocator<char> *)&outputStr);
        terminate(1,&local_70);
      }
    }
  }
  ::carver::Carver::setCarveMode(carver,carveMode);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&outputStr,"-o",(allocator<char> *)&filename);
  pcVar2 = getCmdOption(argv,end,&outputStr,true);
  std::__cxx11::string::~string((string *)&outputStr);
  if (pcVar2 != (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&outputStr,pcVar2,(allocator<char> *)&filename);
    std::__cxx11::string::string<std::allocator<char>>((string *)&filename,"-c",&local_201);
    carveCount = 0;
    pcVar2 = getCmdOption(argv,end,&filename,false);
    std::__cxx11::string::~string((string *)&filename);
    if (pcVar2 == (char *)0x0) {
      iVar3 = 4;
    }
    else {
      carveCount = atoi(pcVar2);
      if (carveCount == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b0,"Invalid argument for carve count",
                   (allocator<char> *)&filename);
        terminate(1,&local_b0);
      }
      iVar3 = 6;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&filename,"-p",&local_201);
    __s = getCmdOption(argv,end,&filename,false);
    std::__cxx11::string::~string((string *)&filename);
    fVar4 = 0.0;
    if (__s == (char *)0x0) {
      fVar4 = 0.15;
    }
    carveAmount = 0.0;
    if (carveCount == 0) {
      carveAmount = fVar4;
    }
    if (__s != (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&filename,__s,&local_201);
      carveAmount = std::__cxx11::stof(&filename,(size_t *)0x0);
      std::__cxx11::string::~string((string *)&filename);
      if ((carveAmount == 0.0) && (!NAN(carveAmount))) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d0,"Invalid argument for carve amount",
                   (allocator<char> *)&filename);
        terminate(1,&local_d0);
      }
      if (pcVar2 != (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_110,"Invalid combination of arguments -p and -c",
                   (allocator<char> *)&filename);
        terminate(1,local_110);
      }
      iVar3 = iVar3 + 2;
    }
    ::carver::Carver::setCarveAmount(carver,carveAmount);
    ::carver::Carver::setCarveCount(carver,carveCount);
    std::__cxx11::string::string<std::allocator<char>>((string *)&filename,"-v",&local_201);
    bVar1 = cmdOptionExists(argv,end,&filename);
    std::__cxx11::string::~string((string *)&filename);
    ::carver::Carver::setVerbosity(carver,bVar1);
    if (argc < (int)(iVar3 + (uint)bVar1 + 2)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_130,"input path not provided",(allocator<char> *)&filename);
      terminate(1,&local_130);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&filename,argv[(ulong)(iVar3 + (uint)bVar1) + 1],&local_201);
    std::__cxx11::string::string((string *)&local_170,(string *)&filename);
    bVar1 = ::carver::Carver::loadTargetImage(carver,&local_170);
    std::__cxx11::string::~string((string *)&local_170);
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_190,(string *)&outputStr);
      ::carver::Carver::carveImage(carver,&local_190);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&filename);
      std::__cxx11::string::~string((string *)&outputStr);
      std::__cxx11::string::~string((string *)&carveModeStr);
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_150,"Image loading failed, please provide path as the last argument"
               ,&local_201);
    terminate(1,&local_150);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"Output path missing",(allocator<char> *)&outputStr);
  terminate(1,&local_90);
}

Assistant:

void setCmdOptionsAndRun(carver::Carver &carver, int argc, char *argv[]) {

    int optionCount = 0;

    // Request for help
    if (cmdOptionExists(argv, argv+argc, "-h")) {
            usage();
            exit(0);
    }

    // Carve mode
    carver::CarveMode carveMode;
    char* carveModeOpt = getCmdOption(argv, argv+argc, "-m", true);
    if (!carveModeOpt)
        terminate(1, "Carve mode value missing");
    string carveModeStr(carveModeOpt);
    optionCount+=2;
    if (carveModeStr == "both")
        carveMode = carver::BOTH;
    else if (carveModeStr == "vertical")
        carveMode = carver::VERTICAL;
    else if (carveModeStr == "horizontal")
        carveMode = carver::HORIZONTAL;
    else
        terminate(1, "Carve mode value invalid");

    carver.setCarveMode(carveMode);

    // Output path
    char* outputOpt = getCmdOption(argv, argv+argc, "-o", true);
    if (!outputOpt)
        terminate(1, "Output path missing");
    string outputStr(outputOpt);
    optionCount+=2;

    // Carve amount, absolute count
    int carveCount = 0;
    char* carveCountOpt = getCmdOption(argv, argv+argc, "-c", false);
    if (carveCountOpt) {
        carveCount = atoi(carveCountOpt);
        optionCount+=2;
        if (carveCount == 0) {
            terminate(1, "Invalid argument for carve count");
        }
    }

    // Carve amount, proportional
    float carveAmount = 0.0f;
    char* carveAmountOpt = getCmdOption(argv, argv+argc, "-p", false);
    if (!carveAmountOpt && !carveCount) {
        carveAmount = 0.15f;
    } else if (carveAmountOpt) {
        try {
            carveAmount = stof(string(carveAmountOpt));
            optionCount+=2;
            if (carveAmount == 0.0f) {
                terminate(1, "Invalid argument for carve amount");
            }
        } catch (invalid_argument&) {
            terminate(1, "Invalid argument for carve amount");
        }
    }

    if (carveAmountOpt && carveCountOpt)
        terminate(1, "Invalid combination of arguments -p and -c");

    carver.setCarveAmount(carveAmount);
    carver.setCarveCount(carveCount);


    // Verbosity
    bool verbose = false;
    if(cmdOptionExists(argv, argv+argc, "-v")) {
        verbose = true;
        optionCount++;
    }
    carver.setVerbosity(verbose);

    // Load target image
    if (argc < optionCount + 2)
        terminate(1, "input path not provided");
    string filename = argv[optionCount + 1];

    if(!carver.loadTargetImage(filename)) {
        terminate(1, "Image loading failed, please provide path as the last argument");
    }

    carver.carveImage(outputStr);
}